

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::StringStreams::release(StringStreams *this,size_t index)

{
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  iterator __position;
  size_t local_18;
  
  pbVar1 = (this->m_streams).
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[index].m_ptr;
  local_18 = index;
  if (pbVar1 != (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::ios::copyfmt((ios *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18)));
    __position._M_current =
         (this->m_unused).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_unused).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_unused,__position,
                 &local_18);
    }
    else {
      *__position._M_current = index;
      (this->m_unused).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    return;
  }
  __assert_fail("m_ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                ,0x4b8,
                "T *Catch::Detail::unique_ptr<std::basic_ostringstream<char>>::operator->() const [T = std::basic_ostringstream<char>]"
               );
}

Assistant:

void release(std::size_t index) {
            m_streams[index]->copyfmt(m_referenceStream); // Restore initial flags and other state
            m_unused.push_back(index);
        }